

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makemon.c
# Opt level: O0

int golemhp(int type)

{
  int local_c;
  int type_local;
  
  switch(type) {
  case 0xff:
    local_c = 0x14;
    break;
  case 0x100:
    local_c = 0x14;
    break;
  case 0x101:
    local_c = 0x14;
    break;
  case 0x102:
    local_c = 0x1e;
    break;
  case 0x103:
    local_c = 0x28;
    break;
  case 0x104:
    local_c = 0x28;
    break;
  case 0x105:
    local_c = 0x32;
    break;
  case 0x106:
    local_c = 0x28;
    break;
  case 0x107:
    local_c = 0x32;
    break;
  case 0x108:
    local_c = 0x3c;
    break;
  case 0x109:
    local_c = 0x3c;
    break;
  case 0x10a:
    local_c = 0x50;
    break;
  default:
    local_c = 0;
  }
  return local_c;
}

Assistant:

int golemhp(int type)
{
	switch(type) {
		case PM_STRAW_GOLEM: return 20;
		case PM_PAPER_GOLEM: return 20;
		case PM_WAX_GOLEM: return 20;
		case PM_ROPE_GOLEM: return 30;
		case PM_LEATHER_GOLEM: return 40;
		case PM_GOLD_GOLEM: return 40;
		case PM_WOOD_GOLEM: return 50;
		case PM_FLESH_GOLEM: return 40;
		case PM_CLAY_GOLEM: return 50;
		case PM_STONE_GOLEM: return 60;
		case PM_GLASS_GOLEM: return 60;
		case PM_IRON_GOLEM: return 80;
		default: return 0;
	}
}